

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdExtension.hpp
# Opt level: O2

string * std::operator<<(string *str,
                        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                        *obj)

{
  string *psVar1;
  stringstream ss;
  string asStack_1b8 [32];
  stringstream local_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(local_198);
  operator<<(local_188,obj);
  std::__cxx11::stringbuf::str();
  psVar1 = (string *)std::__cxx11::string::operator=((string *)str,asStack_1b8);
  std::__cxx11::string::~string(asStack_1b8);
  std::__cxx11::stringstream::~stringstream(local_198);
  return psVar1;
}

Assistant:

string& operator << (string& str, const T& obj) {
  stringstream ss;
  ss << obj; // call ostream& operator << (ostream& os,
  return str = ss.str();
}